

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall helics::apps::Echo::Echo(Echo *this,Echo *other_echo)

{
  App *in_RSI;
  App *in_RDI;
  
  App::App(in_RSI,in_RDI);
  in_RDI->_vptr_App = (_func_int **)&PTR__Echo_009be2c8;
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)in_RSI,
             (deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)in_RDI);
  in_RDI[1].inputFileName.field_2._M_allocated_capacity =
       in_RSI[1].inputFileName.field_2._M_allocated_capacity;
  *(undefined8 *)((long)&in_RDI[1].inputFileName.field_2 + 8) = 0;
  CLI::std::mutex::mutex((mutex *)0x233a9b);
  return;
}

Assistant:

Echo::Echo(Echo&& other_echo) noexcept:
        App(std::move(other_echo)), endpoints(std::move(other_echo.endpoints)),
        delayTime(other_echo.delayTime)
    {
    }